

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestServer.hpp
# Opt level: O3

void __thiscall
test_server::TestServer::TestServer
          (TestServer *this,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator pbVar2;
  size_type sVar3;
  ostream *poVar4;
  child *this_00;
  iterator pbVar5;
  string stringized;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->child)._M_t.
  super___uniq_ptr_impl<boost::process::child,_std::default_delete<boost::process::child>_>._M_t.
  super__Tuple_impl<0UL,_boost::process::child_*,_std::default_delete<boost::process::child>_>.
  super__Head_base<0UL,_boost::process::child_*,_false>._M_head_impl = (child *)0x0;
  pbVar2 = args->_M_array;
  sVar3 = args->_M_len;
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar5 = pbVar2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (sVar3 != 0) {
    std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)(pbVar2->_M_dataplus)._M_p);
    pbVar5 = pbVar2 + 1;
  }
  if (pbVar5 != pbVar2 + sVar3) {
    do {
      std::__cxx11::string::replace((ulong)&local_50,local_50._M_string_length,(char *)0x0,0x193fe1)
      ;
      std::__cxx11::string::replace
                ((ulong)&local_50,local_50._M_string_length,(char *)0x0,
                 (ulong)(pbVar5->_M_dataplus)._M_p);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2 + sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"going to fork to start: ",0x18);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  this_00 = (child *)operator_new(0x20);
  boost::process::child::child<std::__cxx11::string&>(this_00,&local_50);
  std::__uniq_ptr_impl<boost::process::child,_std::default_delete<boost::process::child>_>::reset
            ((__uniq_ptr_impl<boost::process::child,_std::default_delete<boost::process::child>_> *)
             this,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

TestServer(std::initializer_list<std::string> &&args) {
        std::string stringized = boost::algorithm::join(args, " ");
        std::cout << "going to fork to start: " << stringized << std::endl;
        auto process = new boost::process::child(stringized);
        child.reset(process);
    }